

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.hpp
# Opt level: O0

string * cs_impl::to_string<std::pair<cs_impl::any,cs_impl::any>>(pair *p)

{
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_80 [24];
  any *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffa8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [48];
  
  __lhs = &local_50;
  any::to_string_abi_cxx11_(in_stack_ffffffffffffff98);
  std::operator+(__lhs,(char *)in_RDI);
  any::to_string_abi_cxx11_(in_stack_ffffffffffffff98);
  std::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  std::__cxx11::string::~string(local_80);
  std::__cxx11::string::~string(local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return in_RDI;
}

Assistant:

std::string to_string<cs::pair>(const cs::pair &p)
	{
		return p.first.to_string() + " : " + p.second.to_string();
	}